

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  double __x;
  double dVar6;
  string expression;
  shared_ptr<calc::Node> ast;
  vector<calc::Token,_std::allocator<calc::Token>_> tokens;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  string local_80;
  undefined8 *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  double local_50;
  vector<calc::Token,_std::allocator<calc::Token>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"abac console calculator v1.0",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To exit enter \"exit\"",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter arithmetic expression: ",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":> ",3);
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x38);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_a0,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    iVar3 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar3 == 0) break;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_a0,local_a0 + local_98);
    calc::tokenize(&local_48,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    calc::buildAST((calc *)&local_60,&local_48);
    __x = (double)(**(code **)*local_60)();
    dVar6 = modf(__x,&local_50);
    lVar1 = std::cout;
    if ((dVar6 != 0.0) || (NAN(dVar6))) {
      *(uint *)(strcmp + *(long *)(std::cout + -0x18)) =
           *(uint *)(strcmp + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
      poVar5 = std::ostream::_M_insert<double>(__x);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    else {
      poVar5 = std::ostream::_M_insert<double>(__x);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    std::vector<calc::Token,_std::allocator<calc::Token>_>::~vector(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":> ",3);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	cout << "abac console calculator v1.0" << endl;
	cout << "To exit enter \"exit\"" << endl;
	cout << "Enter arithmetic expression: " << endl;
	cout << ":> ";
	string expression;
	while (getline(cin, expression))
	{
		if (expression == "exit")
			break;
		try
		{
			const auto tokens = calc::tokenize(expression);
			const auto ast = calc::buildAST(tokens);
			double result = ast->eval();
			if (isInteger(result))
			{
				cout << result << endl;
			}
			else
			{
				cout << fixed << setprecision(2) << result << endl;
			}
		}
		catch (logic_error & e)
		{
			cout << "Error: " << e.what() << endl;
		}
		cout << ":> ";
	}

	return 0;
}